

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O1

void ImPlot::
     RenderLineSegments<ImPlot::GetterYs<signed_char>,ImPlot::GetterYRef,ImPlot::TransformerLinLog>
               (GetterYs<signed_char> *getter1,GetterYRef *getter2,TransformerLinLog *transformer,
               ImDrawList *DrawList,float line_weight,ImU32 col)

{
  float *pfVar1;
  float fVar2;
  double dVar3;
  double dVar4;
  int iVar5;
  ImPlotPlot *pIVar6;
  double dVar7;
  ImPlotContext *pIVar8;
  ImPlotContext *pIVar9;
  int iVar10;
  float fVar11;
  double dVar12;
  ImVec2 p2;
  ImVec2 p1;
  ImVec2 local_80;
  int local_74;
  ImDrawList *local_70;
  double local_68;
  ImPlotContext *local_60;
  undefined1 local_58 [8];
  GetterYRef *local_50;
  TransformerLinLog *local_48;
  int local_40;
  ImU32 local_3c;
  float local_38;
  
  local_70 = DrawList;
  if (((GImPlot->CurrentPlot->Flags & 0x1000) == 0) && ((GImPlot->Style).AntiAliasedLines != true))
  {
    local_40 = getter2->Count;
    if (getter1->Count < getter2->Count) {
      local_40 = getter1->Count;
    }
    local_58 = (undefined1  [8])getter1;
    local_50 = getter2;
    local_48 = transformer;
    local_3c = col;
    local_38 = line_weight;
    RenderPrimitives<ImPlot::LineSegmentsRenderer<ImPlot::GetterYs<signed_char>,ImPlot::GetterYRef,ImPlot::TransformerLinLog>>
              ((LineSegmentsRenderer<ImPlot::GetterYs<signed_char>,_ImPlot::GetterYRef,_ImPlot::TransformerLinLog>
                *)local_58,DrawList,&GImPlot->CurrentPlot->PlotRect);
  }
  else {
    local_60 = GImPlot;
    local_74 = getter2->Count;
    if (getter1->Count < getter2->Count) {
      local_74 = getter1->Count;
    }
    if (0 < local_74) {
      iVar10 = 0;
      local_68 = 0.0;
      do {
        pIVar8 = GImPlot;
        dVar12 = getter1->XScale * local_68;
        dVar3 = getter1->X0;
        iVar5 = getter1->Count;
        dVar7 = log10((double)(int)getter1->Ys
                                   [(long)(((getter1->Offset + iVar10) % iVar5 + iVar5) % iVar5) *
                                    (long)getter1->Stride] /
                      GImPlot->CurrentPlot->YAxis[transformer->YAxis].Range.Min);
        pIVar9 = GImPlot;
        iVar5 = transformer->YAxis;
        pIVar6 = pIVar8->CurrentPlot;
        dVar4 = pIVar6->YAxis[iVar5].Range.Min;
        local_58._0_4_ =
             (undefined4)
             (((dVar12 + dVar3) - (pIVar6->XAxis).Range.Min) * pIVar8->Mx +
             (double)pIVar8->PixelRange[iVar5].Min.x);
        local_58._4_4_ =
             (float)((((double)(float)(dVar7 / pIVar8->LogDenY[iVar5]) *
                       (pIVar6->YAxis[iVar5].Range.Max - dVar4) + dVar4) - dVar4) *
                     pIVar8->My[iVar5] + (double)pIVar8->PixelRange[iVar5].Min.y);
        dVar7 = getter2->XScale * local_68;
        dVar3 = getter2->X0;
        dVar12 = log10(getter2->YRef / GImPlot->CurrentPlot->YAxis[iVar5].Range.Min);
        iVar5 = transformer->YAxis;
        pIVar6 = pIVar9->CurrentPlot;
        dVar4 = pIVar6->YAxis[iVar5].Range.Min;
        local_80.x = (float)(((dVar7 + dVar3) - (pIVar6->XAxis).Range.Min) * pIVar9->Mx +
                            (double)pIVar9->PixelRange[iVar5].Min.x);
        fVar11 = (float)((((double)(float)(dVar12 / pIVar9->LogDenY[iVar5]) *
                           (pIVar6->YAxis[iVar5].Range.Max - dVar4) + dVar4) - dVar4) *
                         pIVar9->My[iVar5] + (double)pIVar9->PixelRange[iVar5].Min.y);
        local_80.y = fVar11;
        pIVar6 = local_60->CurrentPlot;
        fVar2 = (float)local_58._4_4_;
        if (fVar11 <= (float)local_58._4_4_) {
          fVar2 = fVar11;
        }
        if ((fVar2 < (pIVar6->PlotRect).Max.y) &&
           (fVar2 = (float)(~-(uint)(fVar11 <= (float)local_58._4_4_) & (uint)fVar11 |
                           local_58._4_4_ & -(uint)(fVar11 <= (float)local_58._4_4_)),
           pfVar1 = &(pIVar6->PlotRect).Min.y, *pfVar1 <= fVar2 && fVar2 != *pfVar1)) {
          fVar2 = (float)local_58._0_4_;
          if (local_80.x <= (float)local_58._0_4_) {
            fVar2 = local_80.x;
          }
          if ((fVar2 < (pIVar6->PlotRect).Max.x) &&
             (fVar2 = (float)(~-(uint)(local_80.x <= (float)local_58._0_4_) & (uint)local_80.x |
                             local_58._0_4_ & -(uint)(local_80.x <= (float)local_58._0_4_)),
             (pIVar6->PlotRect).Min.x <= fVar2 && fVar2 != (pIVar6->PlotRect).Min.x)) {
            ImDrawList::AddLine(local_70,(ImVec2 *)local_58,&local_80,col,line_weight);
          }
        }
        local_68 = local_68 + 1.0;
        iVar10 = iVar10 + 1;
      } while (local_74 != iVar10);
    }
  }
  return;
}

Assistant:

inline void RenderLineSegments(const Getter1& getter1, const Getter2& getter2, const Transformer& transformer, ImDrawList& DrawList, float line_weight, ImU32 col) {
    ImPlotContext& gp = *GImPlot;
    if (ImHasFlag(gp.CurrentPlot->Flags, ImPlotFlags_AntiAliased) || gp.Style.AntiAliasedLines) {
        int I = ImMin(getter1.Count, getter2.Count);
        for (int i = 0; i < I; ++i) {
            ImVec2 p1 = transformer(getter1(i));
            ImVec2 p2 = transformer(getter2(i));
            if (gp.CurrentPlot->PlotRect.Overlaps(ImRect(ImMin(p1, p2), ImMax(p1, p2))))
                DrawList.AddLine(p1, p2, col, line_weight);
        }
    }
    else {
        RenderPrimitives(LineSegmentsRenderer<Getter1,Getter2,Transformer>(getter1, getter2, transformer, col, line_weight), DrawList, gp.CurrentPlot->PlotRect);
    }
}